

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O1

double add_regularization<sparse_parameters>
                 (vw *all,bfgs *b,float regularization,sparse_parameters *weights)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  weight *pwVar3;
  byte bVar4;
  ulong uVar5;
  float fVar6;
  double dVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  
  if (b->regularizers == (weight *)0x0) {
    p_Var2 = (weights->_map)._M_h._M_before_begin._M_nxt;
    if (p_Var2 != (_Hash_node_base *)0x0) {
      dVar7 = 0.0;
      do {
        p_Var1 = p_Var2[2]._M_nxt;
        *(float *)((long)&p_Var1->_M_nxt + 4) =
             *(float *)&p_Var1->_M_nxt * regularization + *(float *)((long)&p_Var1->_M_nxt + 4);
        p_Var1 = p_Var2 + 2;
        p_Var2 = p_Var2->_M_nxt;
        dVar9 = (double)*(float *)&p_Var1->_M_nxt->_M_nxt;
        dVar7 = dVar7 + (double)regularization * 0.5 * dVar9 * dVar9;
      } while (p_Var2 != (_Hash_node_base *)0x0);
      goto LAB_001cb073;
    }
  }
  else {
    p_Var2 = (weights->_map)._M_h._M_before_begin._M_nxt;
    if (p_Var2 != (_Hash_node_base *)0x0) {
      dVar7 = 0.0;
      do {
        p_Var1 = p_Var2[2]._M_nxt;
        uVar5 = (ulong)p_Var2[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f);
        fVar8 = *(float *)&p_Var1->_M_nxt - b->regularizers[uVar5 * 2 + 1];
        *(float *)((long)&p_Var1->_M_nxt + 4) =
             b->regularizers[uVar5 * 2] * fVar8 + *(float *)((long)&p_Var1->_M_nxt + 4);
        dVar9 = (double)fVar8;
        dVar7 = dVar7 + (double)b->regularizers[uVar5 * 2] * 0.5 * dVar9 * dVar9;
        p_Var2 = p_Var2->_M_nxt;
      } while (p_Var2 != (_Hash_node_base *)0x0);
      goto LAB_001cb073;
    }
  }
  dVar7 = 0.0;
LAB_001cb073:
  if (all->no_bias == true) {
    bVar4 = (byte)weights->_stride_shift;
    if (b->regularizers == (weight *)0x0) {
      pwVar3 = sparse_parameters::operator[](weights,0xb1c55cL << (bVar4 & 0x3f));
      fVar8 = *pwVar3;
      pwVar3 = sparse_parameters::operator[]
                         (weights,0xb1c55cL << ((byte)weights->_stride_shift & 0x3f));
      pwVar3[1] = pwVar3[1] - fVar8 * regularization;
      pwVar3 = sparse_parameters::operator[]
                         (weights,0xb1c55cL << ((byte)weights->_stride_shift & 0x3f));
      fVar8 = *pwVar3;
      pwVar3 = sparse_parameters::operator[]
                         (weights,0xb1c55cL << ((byte)weights->_stride_shift & 0x3f));
      dVar10 = (double)*pwVar3;
      dVar9 = (double)regularization * -0.5 * (double)fVar8;
    }
    else {
      pwVar3 = sparse_parameters::operator[](weights,0xb1c55cL << (bVar4 & 0x3f));
      uVar5 = (ulong)(uint)((int)(0xb1c55cL >> (bVar4 & 0x3f)) << 3);
      fVar6 = *pwVar3 - *(float *)((long)b->regularizers + uVar5 + 4);
      fVar8 = *(float *)((long)b->regularizers + uVar5);
      pwVar3 = sparse_parameters::operator[]
                         (weights,0xb1c55cL << ((byte)weights->_stride_shift & 0x3f));
      pwVar3[1] = pwVar3[1] - fVar8 * fVar6;
      dVar10 = (double)fVar6;
      dVar9 = (double)*(float *)((long)b->regularizers + uVar5) * -0.5 * dVar10;
    }
    dVar7 = dVar9 * dVar10 + dVar7;
  }
  return dVar7;
}

Assistant:

double add_regularization(vw& all, bfgs& b, float regularization, T& weights)
{
  // compute the derivative difference
  double ret = 0.;

  if (b.regularizers == nullptr)
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      (&(*w))[W_GT] += regularization * (*w);
      ret += 0.5 * regularization * (*w) * (*w);
    }
  else
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      uint64_t i = w.index() >> weights.stride_shift();
      weight delta_weight = *w - b.regularizers[2 * i + 1];
      (&(*w))[W_GT] += b.regularizers[2 * i] * delta_weight;
      ret += 0.5 * b.regularizers[2 * i] * delta_weight * delta_weight;
    }

  // if we're not regularizing the intercept term, then subtract it off from the result above
  // when accessing weights[constant], always use weights.strided_index(constant)
  if (all.no_bias)
  {
    if (b.regularizers == nullptr)
    {
      (&weights.strided_index(constant))[W_GT] -= regularization * (weights.strided_index(constant));
      ret -= 0.5 * regularization * (weights.strided_index(constant)) * (weights.strided_index(constant));
    }
    else
    {
      uint64_t i = constant >> weights.stride_shift();
      weight delta_weight = (weights.strided_index(constant)) - b.regularizers[2 * i + 1];
      (&weights.strided_index(constant))[W_GT] -= b.regularizers[2 * i] * delta_weight;
      ret -= 0.5 * b.regularizers[2 * i] * delta_weight * delta_weight;
    }
  }

  return ret;
}